

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonWriter.cpp
# Opt level: O2

JsonWriter * __thiscall
Corrade::Utility::JsonWriter::operator=(JsonWriter *this,JsonWriter *param_1)

{
  State *pSVar1;
  
  pSVar1 = (this->_state)._pointer;
  (this->_state)._pointer = (param_1->_state)._pointer;
  (param_1->_state)._pointer = pSVar1;
  return this;
}

Assistant:

void JsonWriter::writeCommaNewlineIndentInternal() {
    State& state = *_state;

    /* If this is the root JSON value being written, nothing to do here. Same
       in case an object value is expected. */
    if(state.levels.size() == 1 || state.expecting == Expecting::ObjectValue)
        return;

    /* If we're inside a compact array and it's not time to wrap, add just a
       comma (and potential space after), nothing else to do. */
    if(state.expecting == Expecting::CompactArrayValueOrArrayEnd) {
        const std::size_t currentArraySize = _state->levels.back().second();
        CORRADE_INTERNAL_ASSERT(currentArraySize != ~std::size_t{});
        if(!state.compactArrayWrapAfter || currentArraySize % state.compactArrayWrapAfter != 0) {
            if(state.needsCommaBefore)
                arrayAppend(state.out, state.arrayCommaAndSpace);
            return;
        }
    }

    /* Comma after previous value */
    if(state.needsCommaBefore) arrayAppend(state.out, state.commaAndSpace);

    /* Newline and indent */
    arrayAppend(state.out, state.whitespace.prefix(state.levels.back().first()));
}